

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O3

void textui_cmd_rest(void)

{
  _Bool _Var1;
  byte bVar2;
  wchar_t wVar3;
  command_conflict *cmd;
  wchar_t choice;
  char out_val [5];
  char local_10 [8];
  
  local_10[4] = 0;
  local_10[0] = '&';
  local_10[1] = ' ';
  local_10[2] = '\0';
  local_10[3] = '\0';
  _Var1 = get_string("Rest (0-9999, \'!\': HP/SP, \'*\': HP+SP, \'&\': all, \'$\': sunrise/set): ",
                     local_10,5);
  if (_Var1) {
    bVar2 = local_10[0] - 0x21;
    if ((bVar2 < 10) && ((0x229U >> (bVar2 & 0x1f) & 1) != 0)) {
      choice = *(wchar_t *)(&DAT_0023a804 + (ulong)bVar2 * 4);
    }
    else {
      wVar3 = atoi(local_10);
      if (wVar3 < L'\x01') {
        return;
      }
      choice = L'✏';
      if ((uint)wVar3 < 9999) {
        choice = wVar3;
      }
    }
    cmdq_push(CMD_REST);
    cmd = cmdq_peek();
    cmd_set_arg_choice(cmd,"choice",choice);
  }
  return;
}

Assistant:

void textui_cmd_rest(void)
{
	const char *p = "Rest (0-9999, '!': HP/SP, '*': HP+SP, '&': all, '$': sunrise/set): ";

	char out_val[5] = "& ";

	/* Ask for duration */
	if (!get_string(p, out_val, sizeof(out_val))) return;

	/* Rest... */
	if (out_val[0] == '&') {
		/* ...until done */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_COMPLETE);
	} else if (out_val[0] == '*') {
		/* ...a lot */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_ALL_POINTS);
	} else if (out_val[0] == '!') {
		/* ...until HP or SP filled */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_SOME_POINTS);
	} else if (out_val[0] == '$') {
		/* ...until sunrise or sunset */
		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", REST_SUNLIGHT);
	} else {
		/* ...some */
		int turns = atoi(out_val);
		if (turns <= 0) return;
		if (turns > 9999) turns = 9999;

		cmdq_push(CMD_REST);
		cmd_set_arg_choice(cmdq_peek(), "choice", turns);
	}
}